

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O0

bool Kernel::SortHelper::areSortsValid
               (Term *t0,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *varSorts)

{
  bool bVar1;
  TermList varSrt;
  TermList arg;
  TermList argSrt;
  TermList *args;
  int idx;
  Term *t;
  NonVariableIterator sit;
  NonVariableIterator *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  TermList in_stack_ffffffffffffff00;
  NonVariableIterator *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  Term *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff54;
  TermList in_stack_ffffffffffffff58;
  TermList in_stack_ffffffffffffff68;
  TermList local_90;
  TermList local_88;
  NonVariableIterator *local_80;
  int local_74;
  uint64_t local_70;
  Term *local_68;
  byte local_1;
  
  NonVariableIterator::NonVariableIterator
            ((NonVariableIterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
  do {
    bVar1 = NonVariableIterator::hasNext((NonVariableIterator *)0x97f3ae);
    in_stack_ffffffffffffff54 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
    if (!bVar1) {
      local_1 = 1;
LAB_0097f61d:
      NonVariableIterator::~NonVariableIterator(in_stack_fffffffffffffef0);
      return (bool)(local_1 & 1);
    }
    local_70 = (uint64_t)NonVariableIterator::next(in_stack_ffffffffffffff08);
    local_68 = TermList::term((TermList *)0x97f3ef);
    local_74 = 0;
    local_80 = (NonVariableIterator *)Term::args(local_68);
    while (bVar1 = TermList::isEmpty((TermList *)0x97f43c), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_88 = getArgSort(in_stack_ffffffffffffff58._content,in_stack_ffffffffffffff54);
      local_90._content =
           (uint64_t)(local_80->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore;
      bVar1 = TermList::isVar((TermList *)in_stack_fffffffffffffef0);
      if (bVar1) {
        TermList::TermList((TermList *)&stack0xffffffffffffff68);
        TermList::var(&local_90);
        in_stack_ffffffffffffff17 =
             Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
             findOrInsert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                           *)CONCAT17(in_stack_ffffffffffffff17,
                                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10))
                          ,(uint)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                          (TermList *)in_stack_ffffffffffffff00._content,
                          (TermList *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8))
        ;
        if ((!(bool)in_stack_ffffffffffffff17) &&
           (in_stack_ffffffffffffff16 =
                 TermList::operator!=((TermList *)&stack0xffffffffffffff68,&local_88),
           (bool)in_stack_ffffffffffffff16)) {
          local_1 = 0;
          goto LAB_0097f61d;
        }
      }
      else {
        in_stack_ffffffffffffff08 = (NonVariableIterator *)TermList::term((TermList *)0x97f57a);
        in_stack_ffffffffffffff00 = getResultSort(in_stack_ffffffffffffff68._content);
        in_stack_ffffffffffffff58 = in_stack_ffffffffffffff00;
        in_stack_fffffffffffffeff =
             TermList::operator!=(&local_88,(TermList *)&stack0xffffffffffffff58);
        if ((bool)in_stack_fffffffffffffeff) {
          local_1 = 0;
          goto LAB_0097f61d;
        }
      }
      local_74 = local_74 + 1;
      in_stack_fffffffffffffef0 = (NonVariableIterator *)TermList::next((TermList *)local_80);
      local_80 = in_stack_fffffffffffffef0;
    }
  } while( true );
}

Assistant:

bool SortHelper::areSortsValid(Term* t0, DHMap<unsigned,TermList>& varSorts)
{
  NonVariableIterator sit(t0,true);
  while (sit.hasNext()) {
    Term* t = sit.next().term();
    int idx = 0;
    TermList* args = t->args();
    while (!args->isEmpty()) {
      TermList argSrt = getArgSort(t,idx);
      TermList arg = *args;
      if (arg.isVar()) {
        TermList varSrt;
        if (!varSorts.findOrInsert(arg.var(), varSrt, argSrt)) {
          //the variable is not new
          if (varSrt != argSrt) {
            return false;
          }
        }
      } else {
        if (argSrt != getResultSort(arg.term())) {
          return false;
        }
      }
      idx++;
      args=args->next();
    }
  }
  return true;
}